

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void tcg_gen_gvec_2i_ool_arm
               (TCGContext_conflict *tcg_ctx,uint32_t dofs,uint32_t aofs,TCGv_i64 c,uint32_t oprsz,
               uint32_t maxsz,int32_t data,gen_helper_gvec_2i_conflict *fn)

{
  uint32_t val;
  TCGv_i32 arg;
  TCGv_ptr r;
  TCGv_ptr r_00;
  TCGv_i32 desc;
  TCGv_ptr a1;
  TCGv_ptr a0;
  uint32_t maxsz_local;
  uint32_t oprsz_local;
  TCGv_i64 c_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  TCGContext_conflict *tcg_ctx_local;
  
  val = simd_desc_arm(oprsz,maxsz,data);
  arg = tcg_const_i32_arm(tcg_ctx,val);
  r = tcg_temp_new_ptr(tcg_ctx);
  r_00 = tcg_temp_new_ptr(tcg_ctx);
  tcg_gen_addi_ptr(tcg_ctx,r,tcg_ctx->cpu_env,(ulong)dofs);
  tcg_gen_addi_ptr(tcg_ctx,r_00,tcg_ctx->cpu_env,(ulong)aofs);
  (*fn)(tcg_ctx,r,r_00,c,arg);
  tcg_temp_free_ptr(tcg_ctx,r);
  tcg_temp_free_ptr(tcg_ctx,r_00);
  tcg_temp_free_i32(tcg_ctx,arg);
  return;
}

Assistant:

void tcg_gen_gvec_2i_ool(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, TCGv_i64 c,
                         uint32_t oprsz, uint32_t maxsz, int32_t data,
                         gen_helper_gvec_2i *fn)
{
    TCGv_ptr a0, a1;
    TCGv_i32 desc = tcg_const_i32(tcg_ctx, simd_desc(oprsz, maxsz, data));

    a0 = tcg_temp_new_ptr(tcg_ctx);
    a1 = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, a0, tcg_ctx->cpu_env, dofs);
    tcg_gen_addi_ptr(tcg_ctx, a1, tcg_ctx->cpu_env, aofs);

    fn(tcg_ctx, a0, a1, c, desc);

    tcg_temp_free_ptr(tcg_ctx, a0);
    tcg_temp_free_ptr(tcg_ctx, a1);
    tcg_temp_free_i32(tcg_ctx, desc);
}